

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000016e5d0 = 0x2d2d2d2d2d2d2d;
    uRam000000000016e5d7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016e5c0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016e5c8 = 0x2d2d2d2d2d2d2d;
    DAT_0016e5cf = 0x2d;
    _DAT_0016e5b0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016e5b8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016e5a0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016e5a8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016e598 = 0x2d2d2d2d2d2d2d2d;
    DAT_0016e5df = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }